

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

void __thiscall logging::relog(logging *this,loglevel level,char *fmt,...)

{
  char in_AL;
  bool bVar1;
  undefined8 in_RCX;
  char *in_RDX;
  loglevel in_ESI;
  logging *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  double __x;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char text [1024];
  undefined1 local_4e8 [24];
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined4 local_438;
  undefined4 local_434;
  undefined1 *local_430;
  undefined1 *local_428;
  char local_418 [1024];
  char *local_18;
  loglevel local_c;
  logging *local_8;
  
  if (in_AL != '\0') {
    local_4b8 = in_XMM0_Qa;
    local_4a8 = in_XMM1_Qa;
    local_498 = in_XMM2_Qa;
    local_488 = in_XMM3_Qa;
    local_478 = in_XMM4_Qa;
    local_468 = in_XMM5_Qa;
    local_458 = in_XMM6_Qa;
    local_448 = in_XMM7_Qa;
  }
  local_4d0 = in_RCX;
  local_4c8 = in_R8;
  local_4c0 = in_R9;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_418,0,0x3ff);
  local_428 = local_4e8;
  local_430 = &stack0x00000008;
  local_434 = 0x30;
  local_438 = 0x18;
  vsnprintf(local_418,0x3ff,local_18,&local_438);
  in_RDI->lastrelog = false;
  log(in_RDI,__x);
  bVar1 = doPrint(in_RDI,local_c);
  if (bVar1) {
    in_RDI->lastrelog = true;
  }
  return;
}

Assistant:

void logging::relog(loglevel level, const char* fmt, ... ) {	
	char text[1024];
	memset(text, 0, sizeof(char)*1023);

	va_list ap;
	va_start(ap, fmt);
	vsnprintf(text, 1023, fmt, ap);
	va_end(ap);

	lastrelog = false;
	log(level, "\r%s", text);

	// Check if level suffices...
	if( doPrint(level) )
		lastrelog = true;
}